

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayTextureSizeTFGeometryShader::configureProgram
          (TextureCubeMapArrayTextureSizeTFGeometryShader *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  TestError *this_00;
  pointer_____offset_0x10___ *ppuVar7;
  char *gsCode;
  char *fsCode;
  char *vsCode;
  char *varyings [2];
  long lVar6;
  
  if ((this->super_TextureCubeMapArrayTextureSizeTFBase).super_TextureCubeMapArrayTextureSizeBase.
      super_TestCaseBase.m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
               ,0x28f);
    ppuVar7 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    iVar2 = (*((this->super_TextureCubeMapArrayTextureSizeTFBase).
               super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar2);
    varyings[0]._0_4_ = 0x1bb4d99;
    varyings[0]._4_4_ = 0;
    varyings[1]._0_4_ = 0x1bb4daa;
    varyings[1]._4_4_ = 0;
    (**(code **)(lVar6 + 0x14c8))
              ((this->super_TextureCubeMapArrayTextureSizeTFBase).
               super_TextureCubeMapArrayTextureSizeBase.m_po_id,2,varyings,0x8c8c);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Error setting transform feedback varyings.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                    ,0x298);
    vsCode = 
    "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n    gl_Position      = vec4(0.0f,0.0f,0.0f,0.0f);\n}\n"
    ;
    gsCode = 
    "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\nprecision highp float;\n\nuniform highp samplerCubeArray       texture_std_sampler;\nuniform highp samplerCubeArrayShadow texture_shw_sampler;\n\nlayout (location = 0) out flat uvec3 texture_std_size;\nlayout (location = 1) out flat uvec3 texture_shw_size;\n\nlayout(points)                 in;\nlayout(points, max_vertices=1) out;\n\nvoid main()\n{\n    texture_std_size = uvec3( textureSize(texture_std_sampler, 0) );\n    texture_shw_size = uvec3( textureSize(texture_shw_sampler, 0) );\n    gl_Position      = vec4(0.0f,0.0f,0.0f,0.0f);\n    EmitVertex();\n    EndPrimitive();\n}\n"
    ;
    fsCode = "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n}\n";
    uVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
    *(undefined4 *)&(this->super_TextureCubeMapArrayTextureSizeTFBase).field_0x2c4 = uVar4;
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Could not create shader object.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                    ,0x29f);
    GVar5 = (**(code **)(lVar6 + 0x3f0))
                      ((this->super_TextureCubeMapArrayTextureSizeTFBase).
                       super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_glExtTokens.
                       GEOMETRY_SHADER);
    this->m_gs_id = GVar5;
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Could not create shader object.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                    ,0x2a1);
    GVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar5;
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Could not create shader object.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                    ,0x2a3);
    bVar1 = TestCaseBase::buildProgram
                      ((TestCaseBase *)this,
                       (this->super_TextureCubeMapArrayTextureSizeTFBase).
                       super_TextureCubeMapArrayTextureSizeBase.m_po_id,this->m_fs_id,1,&fsCode,
                       this->m_gs_id,1,&gsCode,
                       *(GLuint *)&(this->super_TextureCubeMapArrayTextureSizeTFBase).field_0x2c4,1,
                       &vsCode,(bool *)0x0);
    if (bVar1) {
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not compile/link program object from valid shader code.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
               ,0x2a8);
    ppuVar7 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar7,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayTextureSizeTFGeometryShader::configureProgram(void)
{
	/* Check if geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set transform feedback varyings */
	const char* varyings[] = { "texture_std_size", "texture_shw_size" };
	gl.transformFeedbackVaryings(m_po_id, m_n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting transform feedback varyings.");

	const char* vsCode = getVertexShaderCode();
	const char* gsCode = getGeometryShaderCode();
	const char* fsCode = getFragmentShaderCode();

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_gs_id, 1 /* part */, &gsCode, m_vs_id, 1 /* part */,
					  &vsCode))
	{
		TCU_FAIL("Could not compile/link program object from valid shader code.");
	}
}